

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O2

bool bssl::ssl_cert_extract_issuer(CBS *in,CBS *out_dn)

{
  int iVar1;
  bool bVar2;
  CBS cert;
  CBS buf;
  CBS toplevel;
  
  buf.data = in->data;
  buf.len = in->len;
  iVar1 = CBS_get_asn1(&buf,&toplevel,0x20000010);
  bVar2 = false;
  if ((iVar1 != 0) && (bVar2 = false, buf.len == 0)) {
    iVar1 = CBS_get_asn1(&toplevel,&cert,0x20000010);
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = CBS_get_optional_asn1(&cert,(CBS *)0x0,(int *)0x0,0xa0000000);
      if (iVar1 != 0) {
        bVar2 = false;
        iVar1 = CBS_get_asn1(&cert,(CBS *)0x0,2);
        if (iVar1 != 0) {
          bVar2 = false;
          iVar1 = CBS_get_asn1(&cert,(CBS *)0x0,0x20000010);
          if (iVar1 != 0) {
            iVar1 = CBS_get_asn1_element(&cert,out_dn,0x20000010);
            bVar2 = iVar1 != 0;
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool ssl_cert_extract_issuer(const CBS *in, CBS *out_dn) {
  CBS buf = *in;

  CBS toplevel;
  CBS cert;
  if (!CBS_get_asn1(&buf, &toplevel, CBS_ASN1_SEQUENCE) ||   //
      CBS_len(&buf) != 0 ||                                  //
      !CBS_get_asn1(&toplevel, &cert, CBS_ASN1_SEQUENCE) ||  //
      // version
      !CBS_get_optional_asn1(
          &cert, NULL, NULL,
          CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||  //
      // serialNumber
      !CBS_get_asn1(&cert, NULL, CBS_ASN1_INTEGER) ||  //
      // signature algorithm
      !CBS_get_asn1(&cert, NULL, CBS_ASN1_SEQUENCE) ||  //
      // issuer
      !CBS_get_asn1_element(&cert, out_dn, CBS_ASN1_SEQUENCE)) {
    return false;
  }
  return true;
}